

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O3

Result __thiscall
spectest::CommandRunner::OnAssertReturnCommand(CommandRunner *this,AssertReturnCommand *command)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint32_t line_number;
  pointer pcVar3;
  pointer pEVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ExpectedValue expected;
  TypedValue actual;
  Result RVar7;
  Enum EVar8;
  long lVar9;
  long lVar10;
  byte bVar11;
  ulong uVar12;
  ActionResult action_result;
  undefined8 local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 auStack_88 [4];
  ActionResult local_78;
  
  RunAction(&local_78,this,(command->super_CommandMixin<(wabt::CommandType)7>).super_Command.line,
            &command->action,Quiet);
  if (local_78.trap.obj_ == (Trap *)0x0) {
    if ((long)local_78.values.
              super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_78.values.
              super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
              super__Vector_impl_data._M_start >> 4 ==
        ((long)(command->expected).
               super__Vector_base<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(command->expected).
               super__Vector_base<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_>
               ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555) {
      if (local_78.values.
          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_78.values.
          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
          super__Vector_impl_data._M_start) {
        EVar8 = Ok;
      }
      else {
        lVar9 = 0;
        lVar10 = 0;
        uVar12 = 0;
        bVar11 = 0;
        do {
          pEVar4 = (command->expected).
                   super__Vector_base<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar5 = *(undefined8 *)
                   ((long)local_78.values.
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar9);
          uVar6 = ((undefined8 *)
                  ((long)local_78.values.
                         super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar9))[1];
          local_98._4_4_ = (undefined4)uVar5;
          uStack_90 = (undefined4)((ulong)uVar5 >> 0x20);
          uStack_8c = (undefined4)uVar6;
          auStack_88[0] = (undefined4)((ulong)uVar6 >> 0x20);
          actual._4_4_ = (undefined4)local_98;
          actual.type.enum_ =
               local_78.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_start[uVar12].enum_;
          puVar1 = (undefined8 *)((long)pEVar4->nan + lVar10 + -0xc);
          puVar2 = (undefined8 *)((long)pEVar4->nan + lVar10 + 4);
          expected.value.value._8_8_ = *puVar1;
          expected.value._0_16_ = *(undefined1 (*) [16])((long)pEVar4->nan + lVar10 + -0x1c);
          expected._24_8_ = puVar1[1];
          expected.nan._4_8_ = *puVar2;
          expected._40_8_ = puVar2[1];
          actual.value.i64_ = uVar5;
          actual.value._8_8_ = uVar6;
          RVar7 = CheckAssertReturnResult(this,command,(int)uVar12,expected,actual,true);
          bVar11 = bVar11 | RVar7.enum_ == Error;
          uVar12 = uVar12 + 1;
          lVar10 = lVar10 + 0x30;
          lVar9 = lVar9 + 0x10;
        } while (uVar12 < (ulong)((long)local_78.values.
                                        super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_78.values.
                                        super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4));
        EVar8 = (Enum)bVar11;
      }
      goto LAB_0016f9a3;
    }
    PrintError(this,(command->super_CommandMixin<(wabt::CommandType)7>).super_Command.line,
               "result length mismatch in assert_return: expected %zd, got %zd");
  }
  else {
    line_number = (command->super_CommandMixin<(wabt::CommandType)7>).super_Command.line;
    pcVar3 = ((local_78.trap.obj_)->message_)._M_dataplus._M_p;
    local_98 = auStack_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar3,pcVar3 + ((local_78.trap.obj_)->message_)._M_string_length
              );
    PrintError(this,line_number,"unexpected trap: %s",local_98);
    if (local_98 != auStack_88) {
      operator_delete(local_98);
    }
  }
  EVar8 = Error;
LAB_0016f9a3:
  if (local_78.trap.obj_ != (Trap *)0x0) {
    wabt::interp::Store::DeleteRoot(local_78.trap.store_,local_78.trap.root_index_);
    local_78.trap.obj_ = (Trap *)0x0;
    local_78.trap.store_ = (Store *)0x0;
    local_78.trap.root_index_ = 0;
  }
  if (local_78.values.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.values.
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return (Result)EVar8;
}

Assistant:

wabt::Result CommandRunner::OnAssertReturnCommand(
    const AssertReturnCommand* command) {
  ActionResult action_result =
      RunAction(command->line, &command->action, RunVerbosity::Quiet);

  if (action_result.trap) {
    PrintError(command->line, "unexpected trap: %s",
               action_result.trap->message().c_str());
    return wabt::Result::Error;
  }

  if (action_result.values.size() != command->expected.size()) {
    PrintError(command->line,
               "result length mismatch in assert_return: expected %" PRIzd
               ", got %" PRIzd,
               command->expected.size(), action_result.values.size());
    return wabt::Result::Error;
  }

  wabt::Result result = wabt::Result::Ok;
  for (size_t i = 0; i < action_result.values.size(); ++i) {
    const ExpectedValue& expected = command->expected[i];
    TypedValue actual{action_result.types[i], action_result.values[i]};

    result |= CheckAssertReturnResult(command, i, expected, actual, true);
  }

  return result;
}